

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetActiveIdUsingNavAndKeys(void)

{
  ImGuiContext *pIVar1;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (GImGui->ActiveId != 0) {
    GImGui->ActiveIdUsingNavDirMask = 0xffffffff;
    pIVar1->ActiveIdUsingNavInputMask = 0xffffffff;
    ImBitArray<133,_-512>::SetAllBits(&pIVar1->ActiveIdUsingKeyInputMask);
    NavMoveRequestCancel();
    return;
  }
  __assert_fail("g.ActiveId != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x13f9,"void ImGui::SetActiveIdUsingNavAndKeys()");
}

Assistant:

void ImGui::SetActiveIdUsingNavAndKeys()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId != 0);
    g.ActiveIdUsingNavDirMask = ~(ImU32)0;
    g.ActiveIdUsingNavInputMask = ~(ImU32)0;
    g.ActiveIdUsingKeyInputMask.SetAllBits();
    NavMoveRequestCancel();
}